

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

vm_obj_id_t CVmObjHTTPRequest::create(int in_root_set,TadsHttpRequest *req,vm_obj_id_t server)

{
  vm_obj_id_t vVar1;
  CVmObjHTTPRequest *this;
  vm_httpreq_ext *pvVar2;
  vm_obj_id_t in_EDX;
  TadsHttpRequest *in_RSI;
  vm_httpreq_ext *ext;
  CVmObjHTTPRequest *r;
  vm_obj_id_t id;
  vm_obj_id_t in_stack_ffffffffffffffcc;
  CVmObjTable *in_stack_ffffffffffffffd0;
  
  vVar1 = vm_new_id((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  CVmObjTable::set_obj_transient(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  this = (CVmObjHTTPRequest *)
         CVmObject::operator_new((size_t)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  CVmObjHTTPRequest(this,in_stack_ffffffffffffffcc);
  pvVar2 = get_ext(this);
  pvVar2->req = in_RSI;
  if (in_RSI != (TadsHttpRequest *)0x0) {
    CVmRefCntObj::add_ref((CVmRefCntObj *)0x256788);
  }
  pvVar2->server = in_EDX;
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjHTTPRequest::create(
    VMG_ int in_root_set, TadsHttpRequest *req, vm_obj_id_t server)
{
    /* create the object - we have no gc-obj refs of any kind */
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);

    /* requests are inherently transient */
    G_obj_table->set_obj_transient(id);

    /* create the C++ object and get its extension */
    CVmObjHTTPRequest *r = new (vmg_ id) CVmObjHTTPRequest(vmg_ TRUE);
    vm_httpreq_ext *ext = r->get_ext();

    /* save the system request object */
    if ((ext->req = req) != 0)
        req->add_ref();

    /* save the server object */
    ext->server = server;

    /* return the new object ID */
    return id;
}